

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportBuildFileGenerator::GenerateMainFile(cmExportBuildFileGenerator *this,ostream *os)

{
  cmGeneratorTarget *target_00;
  size_t gte_00;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  ostream *poVar5;
  reference pTVar6;
  cmGlobalGenerator *pcVar7;
  cmake *pcVar8;
  string *psVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar10;
  reference config;
  pair<std::_Rb_tree_const_iterator<cmGeneratorTarget_*>,_bool> pVar11;
  string_view input;
  string local_690;
  reference local_670;
  string *c_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_3;
  string *c;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  string local_610 [32];
  string_view local_5f0;
  reference local_5e0;
  TargetExport *target;
  iterator __end2;
  iterator __begin2;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  *__range2;
  size_t HASH_TRUNCATION;
  cmCryptoHash hasher;
  string cxx_modules_name;
  undefined1 local_580 [7];
  bool newCMP0022Behavior;
  undefined1 local_570 [16];
  string local_560;
  undefined1 local_540 [8];
  string errorMessage;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  undefined1 local_340 [8];
  ImportPropertyMap properties;
  cmGeneratorTarget *gte;
  TargetExportPrivate *exp;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>
  *__range1_1;
  undefined1 local_2e0 [16];
  string local_2d0;
  undefined1 local_2b0 [8];
  ostringstream e;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  cmGeneratorTarget *local_b8;
  cmGeneratorTarget *te;
  TargetExport *tei;
  iterator __end1;
  iterator __begin1;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  *__range1;
  undefined1 local_78 [7];
  bool generatedInterfaceRequired;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets;
  string sep;
  string expectedTargets;
  ostream *os_local;
  cmExportBuildFileGenerator *this_local;
  
  std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &targets.
              super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  ::vector((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
            *)local_78);
  bVar2 = false;
  GetTargets(this,(vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                   *)local_78);
  __end1 = std::
           vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
           ::begin((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                    *)local_78);
  tei = (TargetExport *)
        std::
        vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
        ::end((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
               *)local_78);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
                                     *)&tei), bVar1) {
    te = (cmGeneratorTarget *)
         __gnu_cxx::
         __normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
         ::operator*(&__end1);
    local_b8 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,(string *)te);
    std::operator+(&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &targets.
                    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   &(this->super_cmExportFileGenerator).Namespace);
    cmGeneratorTarget::GetExportName_abi_cxx11_(&local_118,local_b8);
    std::operator+(&local_d8,&local_f8,&local_118);
    std::__cxx11::string::operator+=((string *)(sep.field_2._M_local_buf + 8),(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::operator=
              ((string *)
               &targets.
                super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage," ");
    pVar11 = std::
             set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
             ::insert(&(this->super_cmExportFileGenerator).ExportedTargets,&local_b8);
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
      poVar5 = std::operator<<((ostream *)local_2b0,"given target \"");
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(local_b8);
      poVar5 = std::operator<<(poVar5,(string *)psVar9);
      std::operator<<(poVar5,"\" more than once.");
      pcVar7 = cmLocalGenerator::GetGlobalGenerator(this->LG);
      pcVar8 = cmGlobalGenerator::GetCMakeInstance(pcVar7);
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::GetMakefile(this->LG);
      cmMakefile::GetBacktrace((cmMakefile *)local_2e0);
      cmake::IssueMessage(pcVar8,FATAL_ERROR,(string *)(local_2e0 + 0x10),
                          (cmListFileBacktrace *)local_2e0);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_2e0);
      std::__cxx11::string::~string((string *)(local_2e0 + 0x10));
      this_local._7_1_ = 0;
      bVar2 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
      goto LAB_006197c5;
    }
    std::
    vector<cmExportBuildFileGenerator::TargetExportPrivate,std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>>
    ::emplace_back<cmGeneratorTarget*&,std::__cxx11::string_const&>
              ((vector<cmExportBuildFileGenerator::TargetExportPrivate,std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>>
                *)&this->Exports,&local_b8,&te->ObjectDirectory);
    TVar3 = GetExportTargetType(this,local_b8);
    bVar2 = bVar2 || TVar3 == INTERFACE_LIBRARY;
    __gnu_cxx::
    __normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
    ::operator++(&__end1);
  }
  if (bVar2) {
    cmExportFileGenerator::SetRequiredCMakeVersion(&this->super_cmExportFileGenerator,3,0,0);
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xc])
            (this,os,(undefined1 *)((long)&sep.field_2 + 8));
  bVar2 = false;
LAB_006197c5:
  std::
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  ::~vector((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
             *)local_78);
  std::__cxx11::string::~string
            ((string *)
             &targets.
              super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
  if (!bVar2) {
    __end1_1 = std::
               vector<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>
               ::begin(&this->Exports);
    exp = (TargetExportPrivate *)
          std::
          vector<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>
          ::end(&this->Exports);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<cmExportBuildFileGenerator::TargetExportPrivate_*,_std::vector<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>_>
                               *)&exp), bVar2) {
      pTVar6 = __gnu_cxx::
               __normal_iterator<cmExportBuildFileGenerator::TargetExportPrivate_*,_std::vector<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>_>
               ::operator*(&__end1_1);
      target_00 = pTVar6->Target;
      properties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)target_00;
      TVar3 = GetExportTargetType(this,target_00);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                (this,os,target_00,(ulong)TVar3);
      cmTarget::AppendBuildInterfaceIncludes
                (*(cmTarget **)properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_340);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,"INTERFACE_INCLUDE_DIRECTORIES",&local_361);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_360,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_340);
      std::__cxx11::string::~string((string *)&local_360);
      std::allocator<char>::~allocator(&local_361);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_388,"INTERFACE_SOURCES",&local_389);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_388,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_340);
      std::__cxx11::string::~string((string *)&local_388);
      std::allocator<char>::~allocator(&local_389);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"INTERFACE_COMPILE_DEFINITIONS",&local_3b1);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_3b0,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_340);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator(&local_3b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d8,"INTERFACE_COMPILE_OPTIONS",&local_3d9);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_3d8,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_340);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::allocator<char>::~allocator(&local_3d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_400,"INTERFACE_PRECOMPILE_HEADERS",&local_401);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_400,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_340);
      std::__cxx11::string::~string((string *)&local_400);
      std::allocator<char>::~allocator(&local_401);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_428,"INTERFACE_AUTOUIC_OPTIONS",&local_429);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_428,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_340);
      std::__cxx11::string::~string((string *)&local_428);
      std::allocator<char>::~allocator(&local_429);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"INTERFACE_AUTOMOC_MACRO_NAMES",&local_451);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_450,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_340);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator(&local_451);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_478,"INTERFACE_COMPILE_FEATURES",&local_479);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_478,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_340);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator(&local_479);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a0,"INTERFACE_LINK_OPTIONS",&local_4a1);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_4a0,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_340);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::allocator<char>::~allocator(&local_4a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c8,"INTERFACE_LINK_DIRECTORIES",&local_4c9);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_4c8,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_340);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::allocator<char>::~allocator(&local_4c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f0,"INTERFACE_LINK_DEPENDS",&local_4f1);
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_4f0,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 BuildInterface,(ImportPropertyMap *)local_340);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::allocator<char>::~allocator(&local_4f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_518,"INTERFACE_POSITION_INDEPENDENT_CODE",
                 (allocator<char> *)(errorMessage.field_2._M_local_buf + 0xf));
      cmExportFileGenerator::PopulateInterfaceProperty
                (&this->super_cmExportFileGenerator,&local_518,
                 (cmGeneratorTarget *)properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (ImportPropertyMap *)local_340);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator((allocator<char> *)(errorMessage.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::string((string *)local_540);
      gte_00 = properties._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::__cxx11::string::string((string *)(local_570 + 0x10));
      bVar2 = cmExportFileGenerator::PopulateCxxModuleExportProperties
                        (&this->super_cmExportFileGenerator,(cmGeneratorTarget *)gte_00,
                         (ImportPropertyMap *)local_340,BuildInterface,(string *)(local_570 + 0x10),
                         (string *)local_540);
      std::__cxx11::string::~string((string *)(local_570 + 0x10));
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        bVar2 = cmExportFileGenerator::PopulateExportProperties
                          (&this->super_cmExportFileGenerator,
                           (cmGeneratorTarget *)
                           properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (ImportPropertyMap *)local_340,(string *)local_540);
        if (bVar2) {
          PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0022
                            ((cmGeneratorTarget *)
                             properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
          bVar2 = false;
          if (PVar4 != WARN) {
            PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0022
                              ((cmGeneratorTarget *)
                               properties._M_t._M_impl.super__Rb_tree_header._M_node_count);
            bVar2 = PVar4 != OLD;
          }
          if (bVar2) {
            cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                      (&this->super_cmExportFileGenerator,
                       (cmGeneratorTarget *)
                       properties._M_t._M_impl.super__Rb_tree_header._M_node_count,BuildInterface,
                       (ImportPropertyMap *)local_340);
          }
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (ImportPropertyMap *)local_340);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                    (this,properties._M_t._M_impl.super__Rb_tree_header._M_node_count,os,local_340);
          cmExportFileGenerator::GenerateTargetFileSets
                    (&this->super_cmExportFileGenerator,
                     (cmGeneratorTarget *)
                     properties._M_t._M_impl.super__Rb_tree_header._M_node_count,os,
                     (cmTargetExport *)0x0);
          bVar2 = false;
        }
        else {
          pcVar7 = cmLocalGenerator::GetGlobalGenerator(this->LG);
          pcVar8 = cmGlobalGenerator::GetCMakeInstance(pcVar7);
          cmLocalGenerator::GetMakefile(this->LG);
          cmMakefile::GetBacktrace((cmMakefile *)local_580);
          cmake::IssueMessage(pcVar8,FATAL_ERROR,(string *)local_540,
                              (cmListFileBacktrace *)local_580);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_580);
          this_local._7_1_ = 0;
          bVar2 = true;
        }
      }
      else {
        pcVar7 = cmLocalGenerator::GetGlobalGenerator(this->LG);
        pcVar8 = cmGlobalGenerator::GetCMakeInstance(pcVar7);
        cmLocalGenerator::GetMakefile(this->LG);
        cmMakefile::GetBacktrace((cmMakefile *)local_570);
        cmake::IssueMessage(pcVar8,FATAL_ERROR,(string *)local_540,(cmListFileBacktrace *)local_570)
        ;
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_570);
        this_local._7_1_ = 0;
        bVar2 = true;
      }
      std::__cxx11::string::~string((string *)local_540);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_340);
      if (bVar2) goto LAB_0061a852;
      __gnu_cxx::
      __normal_iterator<cmExportBuildFileGenerator::TargetExportPrivate_*,_std::vector<cmExportBuildFileGenerator::TargetExportPrivate,_std::allocator<cmExportBuildFileGenerator::TargetExportPrivate>_>_>
      ::operator++(&__end1_1);
    }
    std::__cxx11::string::string((string *)&hasher.CTX);
    if (this->ExportSet == (cmExportSet *)0x0) {
      cmCryptoHash::cmCryptoHash((cmCryptoHash *)&HASH_TRUNCATION,AlgoSHA3_512);
      __end2 = std::
               vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
               ::begin(&this->Targets);
      target = (TargetExport *)
               std::
               vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
               ::end(&this->Targets);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
                                    *)&target);
        if (!bVar2) break;
        local_5e0 = __gnu_cxx::
                    __normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
                    ::operator*(&__end2);
        input = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_5e0);
        local_5f0 = input;
        cmCryptoHash::Append((cmCryptoHash *)&HASH_TRUNCATION,input);
        __gnu_cxx::
        __normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
        ::operator++(&__end2);
      }
      cmCryptoHash::FinalizeHex_abi_cxx11_((string *)&__range1_2,(cmCryptoHash *)&HASH_TRUNCATION);
      std::__cxx11::string::substr((ulong)local_610,(ulong)&__range1_2);
      std::__cxx11::string::operator=((string *)&hasher.CTX,local_610);
      std::__cxx11::string::~string(local_610);
      std::__cxx11::string::~string((string *)&__range1_2);
      cmCryptoHash::~cmCryptoHash((cmCryptoHash *)&HASH_TRUNCATION);
    }
    else {
      psVar9 = cmExportSet::GetName_abi_cxx11_(this->ExportSet);
      std::__cxx11::string::operator=((string *)&hasher.CTX,(string *)psVar9);
    }
    cmExportFileGenerator::GenerateCxxModuleInformation
              (&this->super_cmExportFileGenerator,(string *)&hasher.CTX,os);
    pvVar10 = &(this->super_cmExportFileGenerator).Configurations;
    __end1_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar10);
    c = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(pvVar10);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1_2,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&c);
      if (!bVar2) break;
      config = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_2);
      cmExportFileGenerator::GenerateImportConfig(&this->super_cmExportFileGenerator,os,config);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_2);
    }
    pvVar10 = &(this->super_cmExportFileGenerator).Configurations;
    __end1_3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar10);
    c_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(pvVar10);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1_3,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&c_1);
      if (!bVar2) break;
      local_670 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1_3);
      std::__cxx11::string::string((string *)&local_690,(string *)local_670);
      GenerateImportCxxModuleConfigTargetInclusion(this,(string *)&hasher.CTX,&local_690);
      std::__cxx11::string::~string((string *)&local_690);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_3);
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,os);
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)&hasher.CTX);
  }
LAB_0061a852:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExportBuildFileGenerator::GenerateMainFile(std::ostream& os)
{
  {
    std::string expectedTargets;
    std::string sep;
    std::vector<TargetExport> targets;
    bool generatedInterfaceRequired = false;
    this->GetTargets(targets);
    for (auto const& tei : targets) {
      cmGeneratorTarget* te = this->LG->FindGeneratorTargetToUse(tei.Name);
      expectedTargets += sep + this->Namespace + te->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te).second) {
        this->Exports.emplace_back(te, tei.XcFrameworkLocation);
      } else {
        std::ostringstream e;
        e << "given target \"" << te->GetName() << "\" more than once.";
        this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR, e.str(),
          this->LG->GetMakefile()->GetBacktrace());
        return false;
      }
      generatedInterfaceRequired |=
        this->GetExportTargetType(te) == cmStateEnums::INTERFACE_LIBRARY;
    }

    if (generatedInterfaceRequired) {
      this->SetRequiredCMakeVersion(3, 0, 0);
    }
    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Create all the imported targets.
  for (auto const& exp : this->Exports) {
    cmGeneratorTarget* gte = exp.Target;
    this->GenerateImportTargetCode(os, gte, this->GetExportTargetType(gte));

    gte->Target->AppendBuildInterfaceIncludes();

    ImportPropertyMap properties;

    this->PopulateInterfaceProperty("INTERFACE_INCLUDE_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_SOURCES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_PRECOMPILE_HEADERS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOMOC_MACRO_NAMES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DEPENDS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gte,
                                    properties);

    std::string errorMessage;
    if (!this->PopulateCxxModuleExportProperties(
          gte, properties, cmGeneratorExpression::BuildInterface, {},
          errorMessage)) {
      this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, errorMessage,
        this->LG->GetMakefile()->GetBacktrace());
      return false;
    }

    if (!this->PopulateExportProperties(gte, properties, errorMessage)) {
      this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, errorMessage,
        this->LG->GetMakefile()->GetBacktrace());
      return false;
    }

    const bool newCMP0022Behavior =
      gte->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gte->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      this->PopulateInterfaceLinkLibrariesProperty(
        gte, cmGeneratorExpression::BuildInterface, properties);
    }
    this->PopulateCompatibleInterfaceProperties(gte, properties);

    this->GenerateInterfaceProperties(gte, os, properties);

    this->GenerateTargetFileSets(gte, os);
  }

  std::string cxx_modules_name;
  if (this->ExportSet) {
    cxx_modules_name = this->ExportSet->GetName();
  } else {
    cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_512);
    constexpr std::size_t HASH_TRUNCATION = 12;
    for (auto const& target : this->Targets) {
      hasher.Append(target.Name);
    }
    cxx_modules_name = hasher.FinalizeHex().substr(0, HASH_TRUNCATION);
  }

  this->GenerateCxxModuleInformation(cxx_modules_name, os);

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportConfig(os, c);
  }

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportCxxModuleConfigTargetInclusion(cxx_modules_name, c);
  }

  this->GenerateMissingTargetsCheckCode(os);

  return true;
}